

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti_tool.c
# Opt level: O2

int clear_float_zeros(char *str)

{
  uint uVar1;
  char *__s;
  size_t sVar2;
  long lVar3;
  long lVar4;
  
  __s = strchr(str,0x2e);
  if (__s == (char *)0x0) {
    uVar1 = 0;
  }
  else {
    sVar2 = strlen(__s);
    lVar3 = (long)(int)sVar2 + -1;
    for (lVar4 = lVar3; (1 < lVar4 && ((byte)(__s[lVar4] | 0x10U) == 0x30)); lVar4 = lVar4 + -1) {
      __s[lVar4] = '\0';
    }
    uVar1 = (uint)(lVar4 < lVar3);
  }
  return uVar1;
}

Assistant:

int clear_float_zeros( char * str )
{
   char * dp  = strchr(str, '.'), * valp;
   int    len;

   if( !dp ) return 0;      /* nothing to clear */

   len = strlen(dp);

   /* never clear what is just to the right of '.' */
   for( valp = dp+len-1; (valp > dp+1) && (*valp==' ' || *valp=='0'); valp-- )
       *valp = '\0';     /* clear, so we don't worry about break conditions */

   if( valp < dp + len - 1 ) return 1;
   return 0;
}